

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

CallIndirect * __thiscall
wasm::Builder::makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Name table,Expression *target,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args,HeapType heapType,
          bool isReturn)

{
  bool bVar1;
  CallIndirect *pCVar2;
  uintptr_t extraout_RDX;
  CallIndirect *call;
  bool isReturn_local;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args_local;
  Expression *target_local;
  Builder *this_local;
  HeapType heapType_local;
  Name table_local;
  
  heapType_local.id = table.super_IString.str._M_len;
  this_local = (Builder *)heapType.id;
  bVar1 = HeapType::isSignature((HeapType *)&this_local);
  if (!bVar1) {
    __assert_fail("heapType.isSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                  ,0x122,
                  "CallIndirect *wasm::Builder::makeCallIndirect(const Name, Expression *, const T &, HeapType, bool) [T = std::vector<wasm::Expression *>]"
                 );
  }
  pCVar2 = MixedArena::alloc<wasm::CallIndirect>(&this->wasm->allocator);
  Name::operator=(&pCVar2->table,(Name *)&heapType_local);
  (pCVar2->heapType).id = (uintptr_t)this_local;
  ::wasm::HeapType::getSignature();
  (pCVar2->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id =
       extraout_RDX;
  pCVar2->target = target;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pCVar2->operands,
             args);
  pCVar2->isReturn = isReturn;
  ::wasm::CallIndirect::finalize();
  return pCVar2;
}

Assistant:

CallIndirect* makeCallIndirect(const Name table,
                                 Expression* target,
                                 const T& args,
                                 HeapType heapType,
                                 bool isReturn = false) {
    assert(heapType.isSignature());
    auto* call = wasm.allocator.alloc<CallIndirect>();
    call->table = table;
    call->heapType = heapType;
    call->type = heapType.getSignature().results;
    call->target = target;
    call->operands.set(args);
    call->isReturn = isReturn;
    call->finalize();
    return call;
  }